

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::pop_back(SmallVectorBase<slang::Diagnostic> *this)

{
  SmallVectorBase<slang::Diagnostic> *this_local;
  
  if (this->len == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x97,
               "void slang::SmallVectorBase<slang::Diagnostic>::pop_back() [T = slang::Diagnostic]")
    ;
  }
  this->len = this->len - 1;
  std::destroy_at<slang::Diagnostic>(this->data_ + this->len);
  return;
}

Assistant:

void pop_back() {
        ASSERT(len);
        len--;
        std::destroy_at(data_ + len);
    }